

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

QMdiSubWindow * __thiscall
QMdiAreaPrivate::nextVisibleSubWindow
          (QMdiAreaPrivate *this,int increaseFactor,WindowOrder order,int removedIndex,int fromIndex
          )

{
  long *plVar1;
  QMdiArea *this_00;
  QPointer<QMdiSubWindow> *pQVar2;
  Data *pDVar3;
  undefined1 *puVar4;
  int iVar5;
  QObject *pQVar6;
  int iVar7;
  int iVar8;
  QObject **ppQVar9;
  int iVar10;
  long lVar11;
  QObject *pQVar12;
  QMdiSubWindow *pQVar13;
  long in_FS_OFFSET;
  QList<QMdiSubWindow_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->childWindows).d.size == 0) {
    pQVar13 = (QMdiSubWindow *)0x0;
    goto LAB_0044132b;
  }
  puVar4 = (undefined1 *)(ulong)(uint)fromIndex;
  this_00 = *(QMdiArea **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (QMdiSubWindow **)&DAT_aaaaaaaaaaaaaaaa;
  subWindowList(&local_58,
                *(QMdiAreaPrivate **)
                 &(this_00->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8,order,
                false);
  if (removedIndex < 0) {
    if ((fromIndex < 0) || ((ulong)local_58.d.size <= puVar4)) {
      pQVar6 = (QObject *)QMdiArea::currentSubWindow(this_00);
    }
    else {
      pQVar2 = (this->childWindows).d.ptr;
      pDVar3 = pQVar2[(long)puVar4].wp.d;
      if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) goto LAB_00441246;
      pQVar6 = pQVar2[(long)puVar4].wp.value;
    }
    if (pQVar6 != (QObject *)0x0) goto LAB_00441256;
LAB_00441246:
    ppQVar9 = (QObject **)(local_58.d.ptr + (long)(local_58.d.size + -1));
LAB_00441253:
    pQVar6 = *ppQVar9;
  }
  else {
    if (order != CreationOrder) goto LAB_00441246;
    pQVar6 = (QObject *)0x0;
    pQVar12 = (QObject *)(ulong)(uint)removedIndex;
    if ((int)local_58.d.size + -1 < removedIndex) {
      pQVar12 = pQVar6;
    }
    pQVar2 = (this->childWindows).d.ptr;
    pDVar3 = pQVar2[(long)pQVar12].wp.d;
    if (pDVar3 != (Data *)0x0) {
      if (*(int *)(pDVar3 + 4) == 0) {
        pQVar6 = (QObject *)0x0;
        goto LAB_00441256;
      }
      ppQVar9 = &pQVar2[(long)pQVar12].wp.value;
      goto LAB_00441253;
    }
  }
LAB_00441256:
  if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
LAB_00441286:
    iVar8 = -1;
  }
  else {
    iVar8 = -1;
    lVar11 = 0;
    do {
      if (local_58.d.size * 8 - lVar11 == 0) goto LAB_00441286;
      iVar8 = iVar8 + 1;
      plVar1 = (long *)((long)local_58.d.ptr + lVar11);
      lVar11 = lVar11 + 8;
    } while ((QObject *)*plVar1 != pQVar6);
  }
  iVar10 = iVar8 + increaseFactor;
  iVar7 = (int)local_58.d.size + -1;
  if (increaseFactor < 1) {
    iVar5 = iVar7;
    if ((-1 < iVar10) && (iVar5 = iVar10, iVar7 <= iVar10)) {
      iVar5 = iVar7;
    }
  }
  else {
    iVar5 = 0;
    if ((iVar10 <= iVar7) && (iVar5 = 0, 0 < iVar10)) {
      iVar5 = iVar10;
    }
  }
  do {
    pQVar13 = local_58.d.ptr[iVar5];
    if ((((local_58.d.ptr[iVar5]->super_QWidget).data)->widget_attributes & 0x10000) == 0)
    goto LAB_0044130a;
    iVar10 = iVar5 + increaseFactor;
    if (increaseFactor < 1) {
      iVar5 = iVar7;
      if ((-1 < iVar10) && (iVar5 = iVar10, iVar7 <= iVar10)) {
        iVar5 = iVar7;
      }
    }
    else {
      iVar5 = 0;
      if ((iVar10 <= iVar7) && (iVar5 = iVar10, iVar10 < 1)) {
        iVar5 = 0;
      }
    }
  } while (iVar5 != iVar8);
  pQVar13 = (QMdiSubWindow *)0x0;
  if ((((local_58.d.ptr[iVar8]->super_QWidget).data)->widget_attributes & 0x10000) == 0) {
    pQVar13 = local_58.d.ptr[iVar8];
  }
LAB_0044130a:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
    }
  }
LAB_0044132b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar13;
}

Assistant:

QMdiSubWindow *QMdiAreaPrivate::nextVisibleSubWindow(int increaseFactor, QMdiArea::WindowOrder order,
                                                     int removedIndex, int fromIndex) const
{
    if (childWindows.isEmpty())
        return nullptr;

    Q_Q(const QMdiArea);
    const QList<QMdiSubWindow *> subWindows = q->subWindowList(order);
    QMdiSubWindow *current = nullptr;

    if (removedIndex < 0) {
        if (fromIndex >= 0 && fromIndex < subWindows.size())
            current = childWindows.at(fromIndex);
        else
            current = q->currentSubWindow();
    }

    // There's no current sub-window (removed or deactivated),
    // so we have to pick the last active or the next in creation order.
    if (!current) {
        if (removedIndex >= 0 && order == QMdiArea::CreationOrder) {
            int candidateIndex = -1;
            setIndex(&candidateIndex, removedIndex, 0, subWindows.size() - 1, true);
            current = childWindows.at(candidateIndex);
        } else {
            current = subWindows.back();
        }
    }
    Q_ASSERT(current);

    // Find the index for the current sub-window in the given activation order
    const int indexToCurrent = subWindows.indexOf(current);
    const bool increasing = increaseFactor > 0;

    // and use that index + increseFactor as a candidate.
    int index = -1;
    setIndex(&index, indexToCurrent + increaseFactor, 0, subWindows.size() - 1, increasing);
    Q_ASSERT(index != -1);

    // Try to find another window if the candidate is hidden.
    while (subWindows.at(index)->isHidden()) {
        setIndex(&index, index + increaseFactor, 0, subWindows.size() - 1, increasing);
        if (index == indexToCurrent)
            break;
    }

    if (!subWindows.at(index)->isHidden())
        return subWindows.at(index);
    return nullptr;
}